

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap1.c
# Opt level: O0

void Cffgiou(int *unit,int *status)

{
  int local_1c;
  int i;
  int *status_local;
  int *unit_local;
  
  if (*status < 1) {
    for (local_1c = 0x32; (local_1c < 10000 && (gFitsFiles[local_1c] != (fitsfile *)0x0));
        local_1c = local_1c + 1) {
    }
    if (local_1c == 10000) {
      *unit = 0;
      *status = 0x67;
      ffpmsg("Cffgiou has no more available unit numbers.");
    }
    else {
      *unit = local_1c;
      gFitsFiles[local_1c] = (fitsfile *)0x1;
    }
  }
  return;
}

Assistant:

void Cffgiou( int *unit, int *status )
{
   int i;

   if( *status>0 ) return;
   FFLOCK;
   for( i=50;i<NMAXFILES;i++ ) /* Using a unit=0 sounds bad, so start at 1 */
      if( gFitsFiles[i]==NULL ) break;
   if( i==NMAXFILES ) {
      *unit = 0;
      *status = TOO_MANY_FILES;
      ffpmsg("Cffgiou has no more available unit numbers.");
   } else {
      *unit=i;
      gFitsFiles[i] = (fitsfile *)1; /*  Flag it as taken until ftopen/init  */
                                     /*  can be called and set a real value  */
   }
   FFUNLOCK;
}